

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O2

void amrex::EB_average_down_faces
               (Array<const_MultiFab_*,_3> *fine,Array<MultiFab_*,_3> *crse,IntVect *ratio,
               int ngcrse)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  FabArray<amrex::FArrayBox> *this;
  Array<MultiFab_*,_3> *pAVar7;
  bool bVar8;
  int jj;
  FabType FVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  EBFArrayBoxFactory *this_00;
  EBCellFlagFab *this_01;
  long lVar13;
  long lVar14;
  long lVar15;
  Periodicity *period;
  int iVar16;
  long lVar17;
  int iVar18;
  Array<const_MultiFab_*,_3> *pAVar19;
  ulong uVar20;
  double *pdVar21;
  FabArray<amrex::FArrayBox> *src;
  ulong uVar22;
  double *pdVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  double *pdVar34;
  ulong uVar35;
  MFIter *this_02;
  int idim;
  double *pdVar36;
  double dVar37;
  double dVar38;
  undefined1 local_650 [24];
  long local_638;
  Dim3 aDStack_630 [2];
  long local_610;
  long local_608;
  long local_600;
  int local_5f8;
  int local_5f4;
  Array<const_MultiFab_*,_3> *local_5f0;
  ulong local_5e8;
  ulong local_5e0;
  IntVect *local_5d8;
  long local_5d0;
  Box result;
  undefined4 uStack_5ac;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  Box local_554;
  long local_538;
  long local_530;
  long local_528;
  long local_520;
  Array<MultiFab_*,_3> *local_518;
  Array4<const_double> local_510;
  ulong local_4d0;
  Array<const_MultiCutFab_*,_3> local_4c8;
  MFIter mfi;
  undefined1 local_330 [384];
  undefined1 local_1b0 [384];
  
  uVar35 = (ulong)(uint)ngcrse;
  uVar2 = (crse->_M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  bVar8 = FabArray<amrex::FArrayBox>::hasEBFabFactory
                    (&fine->_M_elems[0]->super_FabArray<amrex::FArrayBox>);
  if (!bVar8) {
    average_down_faces(fine,crse,ratio,ngcrse);
    return;
  }
  iVar3 = ratio->vect[0];
  lVar10 = (long)iVar3;
  iVar4 = ratio->vect[1];
  lVar11 = (long)iVar4;
  iVar5 = ratio->vect[2];
  lVar12 = (long)iVar5;
  local_5d8 = ratio;
  this_00 = (EBFArrayBoxFactory *)
            __dynamic_cast((fine->_M_elems[0]->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
  if (this_00 == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  EBFArrayBoxFactory::getAreaFrac(&local_4c8,this_00);
  local_5f0 = fine;
  bVar8 = isMFIterSafe((FabArrayBase *)fine->_M_elems[0],(FabArrayBase *)crse->_M_elems[0]);
  local_5e0 = uVar35;
  local_518 = crse;
  if (bVar8) {
    uVar35 = 0;
    pAVar19 = local_5f0;
    local_5e8 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      local_5e8 = uVar35;
    }
    for (; uVar35 != 3; uVar35 = uVar35 + 1) {
      MFIter::MFIter(&mfi,(FabArrayBase *)crse->_M_elems[uVar35],true);
      local_4d0 = uVar35;
      while (uVar35 = local_4d0, mfi.currentIndex < mfi.endIndex) {
        iVar18 = mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          iVar18 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[mfi.currentIndex];
        }
        this_01 = getEBCellFlagFab((pAVar19->_M_elems[local_4d0]->super_FabArray<amrex::FArrayBox>).
                                   m_fabs_v.
                                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar18]);
        MFIter::growntilebox(&local_554,&mfi,(int)local_5e0);
        result.smallend.vect[1] = local_554.smallend.vect[1];
        result.smallend.vect[0] = local_554.smallend.vect[0];
        result.bigend.vect[1] = local_554.bigend.vect[1];
        result.bigend.vect[2] = local_554.bigend.vect[2];
        result.btype.itype = local_554.btype.itype;
        result.smallend.vect[2] = local_554.smallend.vect[2];
        result.bigend.vect[0] = local_554.bigend.vect[0];
        iVar18 = local_5d8->vect[0];
        iVar28 = local_5d8->vect[1];
        iVar33 = local_5d8->vect[2];
        if (iVar33 != 1 || (iVar28 != 1 || iVar18 != 1)) {
          uVar2 = (uint)((local_554.btype.itype & 2) == 0);
          result.smallend.vect[1] = local_554.smallend.vect[1] * iVar28;
          result.smallend.vect[0] = local_554.smallend.vect[0] * iVar18;
          result.smallend.vect[2] = local_554.smallend.vect[2] * iVar33;
          uVar24 = (uint)((local_554.btype.itype & 4) == 0);
          result.bigend.vect[0] =
               (local_554.bigend.vect[0] + (~local_554.btype.itype & 1)) * iVar18 -
               (~local_554.btype.itype & 1);
          result.bigend.vect[1] = (local_554.bigend.vect[1] + uVar2) * iVar28 - uVar2;
          result.bigend.vect[2] = (local_554.bigend.vect[2] + uVar24) * iVar33 - uVar24;
        }
        FVar9 = EBCellFlagFab::getType(this_01,&result);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&result,
                   &crse->_M_elems[uVar35]->super_FabArray<amrex::FArrayBox>,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_650,
                   &local_5f0->_M_elems[uVar35]->super_FabArray<amrex::FArrayBox>,&mfi);
        iVar18 = (int)uVar35;
        if ((uint)(FVar9 + singlevalued) < 2) {
          lVar13 = (long)local_554.smallend.vect[0];
          local_608 = CONCAT44(local_608._4_4_,local_554.smallend.vect[2]);
          lVar14 = (long)local_554.bigend.vect[0];
          local_600 = (long)local_554.bigend.vect[2];
          uVar2 = local_5d8->vect[0];
          uVar24 = local_5d8->vect[1];
          uVar6 = local_5d8->vect[2];
          if (iVar18 == 0) {
            uVar35 = 0;
            if (0 < (int)uVar24) {
              uVar35 = (ulong)uVar24;
            }
            uVar20 = 0;
            if (0 < (int)uVar6) {
              uVar20 = (ulong)uVar6;
            }
            for (uVar30 = 0; lVar17 = (long)local_554.smallend.vect[2], uVar30 != local_5e8;
                uVar30 = uVar30 + 1) {
              for (; lVar17 <= local_600; lVar17 = lVar17 + 1) {
                iVar18 = local_554.smallend.vect[1] * uVar24;
                for (lVar25 = (long)local_554.smallend.vect[1]; lVar25 <= local_554.bigend.vect[1];
                    lVar25 = lVar25 + 1) {
                  for (lVar27 = lVar13; lVar27 <= lVar14; lVar27 = lVar27 + 1) {
                    dVar37 = 0.0;
                    for (uVar22 = 0; uVar22 != uVar20; uVar22 = uVar22 + 1) {
                      uVar29 = uVar35;
                      iVar28 = iVar18 - aDStack_630[0].y;
                      while (bVar8 = uVar29 != 0, uVar29 = uVar29 - 1, bVar8) {
                        dVar37 = dVar37 + *(double *)
                                           (local_650._0_8_ +
                                           ((lVar27 * (int)uVar2 - (long)aDStack_630[0].x) +
                                           local_638 * uVar30 +
                                           (long)(int)(((int)uVar22 + (int)lVar17 * uVar6) -
                                                      aDStack_630[0].z) * local_650._16_8_ +
                                           local_650._8_8_ * (long)iVar28) * 8);
                        iVar28 = iVar28 + 1;
                      }
                    }
                    *(double *)
                     ((lVar25 - (int)local_5a4) *
                      CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                      result.smallend.vect._0_8_ +
                      (lVar17 - (int)local_5a0) *
                      CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                      CONCAT44(uStack_5ac,result.btype.itype) * uVar30 * 8 +
                     (lVar27 - (int)local_5a8) * 8) = dVar37 * (1.0 / (double)(int)(uVar6 * uVar24))
                    ;
                  }
                  iVar18 = iVar18 + uVar24;
                }
              }
            }
          }
          else if (iVar18 == 1) {
            uVar35 = 0;
            if (0 < (int)uVar2) {
              uVar35 = (ulong)uVar2;
            }
            uVar20 = 0;
            if (0 < (int)uVar6) {
              uVar20 = (ulong)uVar6;
            }
            for (uVar30 = 0; lVar17 = (long)local_554.smallend.vect[2], uVar30 != local_5e8;
                uVar30 = uVar30 + 1) {
              for (; lVar17 <= local_600; lVar17 = lVar17 + 1) {
                for (iVar18 = local_554.smallend.vect[1]; iVar18 <= local_554.bigend.vect[1];
                    iVar18 = iVar18 + 1) {
                  iVar28 = local_554.smallend.vect[0] * uVar2;
                  for (lVar25 = lVar13; lVar25 <= lVar14; lVar25 = lVar25 + 1) {
                    dVar37 = 0.0;
                    for (uVar22 = 0; uVar22 != uVar20; uVar22 = uVar22 + 1) {
                      uVar29 = uVar35;
                      iVar33 = iVar28 - aDStack_630[0].x;
                      while (bVar8 = uVar29 != 0, uVar29 = uVar29 - 1, bVar8) {
                        dVar37 = dVar37 + *(double *)
                                           (local_650._0_8_ +
                                           (((long)(int)(iVar18 * uVar24) - (long)aDStack_630[0].y)
                                            * local_650._8_8_ +
                                           local_638 * uVar30 +
                                           (long)(int)(((int)uVar22 + (int)lVar17 * uVar6) -
                                                      aDStack_630[0].z) * local_650._16_8_ +
                                           (long)iVar33) * 8);
                        iVar33 = iVar33 + 1;
                      }
                    }
                    *(double *)
                     (((long)iVar18 - (long)(int)local_5a4) *
                      CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                      result.smallend.vect._0_8_ +
                      (lVar17 - (int)local_5a0) *
                      CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                      CONCAT44(uStack_5ac,result.btype.itype) * uVar30 * 8 +
                     (lVar25 - (int)local_5a8) * 8) = dVar37 * (1.0 / (double)(int)(uVar6 * uVar2));
                    iVar28 = iVar28 + uVar2;
                  }
                }
              }
            }
          }
          else if (iVar18 == 2) {
            uVar35 = 0;
            if (0 < (int)uVar2) {
              uVar35 = (ulong)uVar2;
            }
            uVar20 = 0;
            if (0 < (int)uVar24) {
              uVar20 = (ulong)uVar24;
            }
            for (uVar30 = 0; iVar18 = local_554.smallend.vect[2], uVar30 != local_5e8;
                uVar30 = uVar30 + 1) {
              for (; iVar18 <= local_554.bigend.vect[2]; iVar18 = iVar18 + 1) {
                for (lVar17 = (long)local_554.smallend.vect[1]; lVar17 <= local_554.bigend.vect[1];
                    lVar17 = lVar17 + 1) {
                  iVar28 = local_554.smallend.vect[0] * uVar2;
                  for (lVar25 = lVar13; lVar25 <= lVar14; lVar25 = lVar25 + 1) {
                    dVar37 = 0.0;
                    for (uVar22 = 0; uVar22 != uVar20; uVar22 = uVar22 + 1) {
                      uVar29 = uVar35;
                      iVar33 = iVar28 - aDStack_630[0].x;
                      while (bVar8 = uVar29 != 0, uVar29 = uVar29 - 1, bVar8) {
                        dVar37 = dVar37 + *(double *)
                                           (local_650._0_8_ +
                                           (((long)(int)(iVar18 * uVar6) - (long)aDStack_630[0].z) *
                                            local_650._16_8_ +
                                           local_638 * uVar30 +
                                           (long)(int)(((int)uVar22 + (int)lVar17 * uVar24) -
                                                      aDStack_630[0].y) * local_650._8_8_ +
                                           (long)iVar33) * 8);
                        iVar33 = iVar33 + 1;
                      }
                    }
                    *(double *)
                     ((lVar17 - (int)local_5a4) *
                      CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                      result.smallend.vect._0_8_ +
                      ((long)iVar18 - (long)(int)local_5a0) *
                      CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                      CONCAT44(uStack_5ac,result.btype.itype) * uVar30 * 8 +
                     (lVar25 - (int)local_5a8) * 8) = dVar37 * (1.0 / (double)(int)(uVar24 * uVar2))
                    ;
                    iVar28 = iVar28 + uVar2;
                  }
                }
              }
            }
          }
        }
        else {
          MultiCutFab::const_array(&local_510,local_4c8._M_elems[uVar35],&mfi);
          local_610 = CONCAT44(local_610._4_4_,local_554.smallend.vect[0]);
          local_530 = (long)local_554.smallend.vect[0];
          local_600 = (long)local_554.bigend.vect[0];
          local_528 = (long)local_554.bigend.vect[1];
          local_538 = (long)local_554.bigend.vect[2];
          if (iVar18 == 1) {
            local_610 = CONCAT44(local_610._4_4_,local_554.smallend.vect[0] * iVar3);
            iVar18 = local_554.smallend.vect[2] * iVar5;
            local_5f8 = iVar4 * local_554.smallend.vect[1];
            lVar13 = (long)local_554.smallend.vect[2];
            while (lVar13 <= local_538) {
              lVar14 = (long)iVar18;
              local_520 = lVar13 * lVar12;
              local_5d0 = lVar13 + 1;
              iVar28 = local_5f8;
              for (iVar33 = local_554.smallend.vect[1]; iVar16 = iVar28,
                  iVar33 <= local_554.bigend.vect[1]; iVar33 = iVar33 + 1) {
                local_608 = (long)(iVar33 * iVar4);
                lVar17 = local_530;
                iVar28 = local_554.smallend.vect[0] * iVar3;
                while (lVar17 <= local_600) {
                  lVar25 = (long)iVar28 * 8;
                  lVar27 = 0;
                  for (uVar35 = 0; uVar35 != local_5e8; uVar35 = uVar35 + 1) {
                    lVar32 = local_650._0_8_ +
                             local_638 * lVar27 +
                             (lVar14 - aDStack_630[0].z) * local_650._16_8_ * 8 +
                             ((long)iVar16 - (long)aDStack_630[0].y) * local_650._8_8_ * 8 +
                             (long)aDStack_630[0].x * -8 + lVar25;
                    lVar15 = (long)local_510.p +
                             (lVar14 - local_510.begin.z) * local_510.kstride * 8 +
                             ((long)iVar16 - (long)local_510.begin.y) * local_510.jstride * 8 +
                             (long)local_510.begin.x * -8 + lVar25;
                    dVar37 = 0.0;
                    dVar38 = 0.0;
                    for (lVar31 = lVar14; lVar31 < local_5d0 * lVar12; lVar31 = lVar31 + 1) {
                      for (lVar26 = 0; iVar28 + lVar26 < (lVar17 + 1) * lVar10; lVar26 = lVar26 + 1)
                      {
                        dVar1 = *(double *)(lVar15 + lVar26 * 8);
                        dVar37 = dVar37 + *(double *)(lVar32 + lVar26 * 8) * dVar1;
                        dVar38 = dVar38 + dVar1;
                      }
                      lVar32 = lVar32 + local_650._16_8_ * 8;
                      lVar15 = lVar15 + local_510.kstride * 8;
                    }
                    if (dVar38 <= 1e-30) {
                      dVar37 = *(double *)
                                (local_650._0_8_ +
                                ((local_608 - aDStack_630[0].y) * local_650._8_8_ +
                                (lVar17 * lVar10 - (long)aDStack_630[0].x) +
                                (local_520 - aDStack_630[0].z) * local_650._16_8_ +
                                local_638 * uVar35) * 8);
                    }
                    else {
                      dVar37 = dVar37 / dVar38;
                    }
                    *(double *)
                     (((long)iVar33 - (long)(int)local_5a4) *
                      CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                      result.smallend.vect._0_8_ + (lVar17 - (int)local_5a8) * 8 +
                      (lVar13 - (int)local_5a0) *
                      CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                     CONCAT44(uStack_5ac,result.btype.itype) * uVar35 * 8) = dVar37;
                    lVar27 = lVar27 + 8;
                  }
                  iVar28 = iVar28 + iVar3;
                  lVar17 = lVar17 + 1;
                }
                iVar28 = iVar16 + iVar4;
                local_5f4 = iVar16;
              }
              iVar18 = iVar18 + iVar5;
              lVar13 = local_5d0;
            }
          }
          else {
            local_5d0 = (long)local_554.smallend.vect[1];
            if (iVar18 == 0) {
              iVar18 = local_554.smallend.vect[2] * iVar5;
              lVar13 = (long)local_554.smallend.vect[2];
              while (lVar13 <= local_538) {
                lVar17 = (long)iVar18;
                local_608 = lVar13 + 1;
                lVar14 = local_5d0;
                iVar28 = local_554.smallend.vect[1] * iVar4;
                while (lVar14 <= local_528) {
                  lVar25 = (long)iVar28;
                  iVar33 = iVar3 * local_554.smallend.vect[0];
                  for (iVar16 = local_554.smallend.vect[0]; iVar16 <= local_554.bigend.vect[0];
                      iVar16 = iVar16 + 1) {
                    lVar27 = 0;
                    for (uVar35 = 0; uVar35 != local_5e8; uVar35 = uVar35 + 1) {
                      pdVar34 = (double *)
                                (local_650._0_8_ +
                                local_638 * lVar27 +
                                (lVar25 - aDStack_630[0].y) * local_650._8_8_ * 8 +
                                (lVar17 - aDStack_630[0].z) * local_650._16_8_ * 8 +
                                (long)aDStack_630[0].x * -8 + (long)iVar33 * 8);
                      pdVar21 = (double *)
                                ((long)local_510.p +
                                (lVar25 - local_510.begin.y) * local_510.jstride * 8 +
                                (lVar17 - local_510.begin.z) * local_510.kstride * 8 +
                                (long)local_510.begin.x * -8 + (long)iVar33 * 8);
                      dVar37 = 0.0;
                      dVar38 = 0.0;
                      for (lVar31 = lVar17; lVar15 = lVar25, pdVar23 = pdVar21, pdVar36 = pdVar34,
                          lVar31 < local_608 * lVar12; lVar31 = lVar31 + 1) {
                        for (; lVar15 < (lVar14 + 1) * lVar11; lVar15 = lVar15 + 1) {
                          dVar37 = dVar37 + *pdVar36 * *pdVar23;
                          dVar38 = dVar38 + *pdVar23;
                          pdVar23 = pdVar23 + local_510.jstride;
                          pdVar36 = pdVar36 + local_650._8_8_;
                        }
                        pdVar34 = pdVar34 + local_650._16_8_;
                        pdVar21 = pdVar21 + local_510.kstride;
                      }
                      if (dVar38 <= 1e-30) {
                        dVar37 = *(double *)
                                  (local_650._0_8_ +
                                  ((lVar14 * lVar11 - (long)aDStack_630[0].y) * local_650._8_8_ +
                                  ((long)(iVar16 * iVar3) - (long)aDStack_630[0].x) +
                                  (lVar13 * lVar12 - (long)aDStack_630[0].z) * local_650._16_8_ +
                                  local_638 * uVar35) * 8);
                      }
                      else {
                        dVar37 = dVar37 / dVar38;
                      }
                      *(double *)
                       ((lVar14 - (int)local_5a4) *
                        CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                        result.smallend.vect._0_8_ + ((long)iVar16 - (long)(int)local_5a8) * 8 +
                        (lVar13 - (int)local_5a0) *
                        CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                       CONCAT44(uStack_5ac,result.btype.itype) * uVar35 * 8) = dVar37;
                      lVar27 = lVar27 + 8;
                    }
                    iVar33 = iVar33 + iVar3;
                  }
                  iVar28 = iVar4 + iVar28;
                  lVar14 = lVar14 + 1;
                }
                iVar18 = iVar5 + iVar18;
                lVar13 = local_608;
              }
            }
            else {
              local_5f4 = local_554.smallend.vect[0] * iVar3;
              local_5f8 = local_554.smallend.vect[1] * iVar4;
              iVar28 = iVar5 * local_554.smallend.vect[2];
              for (iVar18 = local_554.smallend.vect[2]; iVar18 <= local_554.bigend.vect[2];
                  iVar18 = iVar18 + 1) {
                local_520 = (long)(iVar18 * iVar5);
                local_608 = CONCAT44(local_608._4_4_,iVar18);
                lVar13 = local_5d0;
                iVar33 = local_5f8;
                while (lVar13 <= local_528) {
                  lVar17 = (long)iVar33;
                  local_610 = lVar13 + 1;
                  lVar14 = local_530;
                  iVar16 = local_5f4;
                  while (lVar14 <= local_600) {
                    lVar25 = (long)iVar16 * 8;
                    lVar27 = 0;
                    for (uVar35 = 0; uVar35 != local_5e8; uVar35 = uVar35 + 1) {
                      lVar32 = local_650._0_8_ +
                               local_638 * lVar27 +
                               (lVar17 - aDStack_630[0].y) * local_650._8_8_ * 8 +
                               ((long)iVar28 - (long)aDStack_630[0].z) * local_650._16_8_ * 8 +
                               (long)aDStack_630[0].x * -8 + lVar25;
                      lVar15 = (long)local_510.p +
                               (lVar17 - local_510.begin.y) * local_510.jstride * 8 +
                               ((long)iVar28 - (long)local_510.begin.z) * local_510.kstride * 8 +
                               (long)local_510.begin.x * -8 + lVar25;
                      dVar37 = 0.0;
                      dVar38 = 0.0;
                      for (lVar31 = lVar17; lVar31 < local_610 * lVar11; lVar31 = lVar31 + 1) {
                        for (lVar26 = 0; iVar16 + lVar26 < (lVar14 + 1) * lVar10;
                            lVar26 = lVar26 + 1) {
                          dVar1 = *(double *)(lVar15 + lVar26 * 8);
                          dVar37 = dVar37 + *(double *)(lVar32 + lVar26 * 8) * dVar1;
                          dVar38 = dVar38 + dVar1;
                        }
                        lVar32 = lVar32 + local_650._8_8_ * 8;
                        lVar15 = lVar15 + local_510.jstride * 8;
                      }
                      if (dVar38 <= 1e-30) {
                        dVar37 = *(double *)
                                  (local_650._0_8_ +
                                  ((lVar13 * lVar11 - (long)aDStack_630[0].y) * local_650._8_8_ +
                                  (lVar14 * lVar10 - (long)aDStack_630[0].x) +
                                  (local_520 - aDStack_630[0].z) * local_650._16_8_ +
                                  local_638 * uVar35) * 8);
                      }
                      else {
                        dVar37 = dVar37 / dVar38;
                      }
                      *(double *)
                       ((lVar13 - (int)local_5a4) *
                        CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                        result.smallend.vect._0_8_ + (lVar14 - (int)local_5a8) * 8 +
                        ((long)iVar18 - (long)(int)local_5a0) *
                        CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                       CONCAT44(uStack_5ac,result.btype.itype) * uVar35 * 8) = dVar37;
                      lVar27 = lVar27 + 8;
                    }
                    iVar16 = iVar16 + iVar3;
                    lVar14 = lVar14 + 1;
                  }
                  iVar33 = iVar4 + iVar33;
                  lVar13 = local_610;
                }
                iVar28 = iVar28 + iVar5;
              }
            }
          }
        }
        MFIter::operator++(&mfi);
        pAVar19 = local_5f0;
        crse = local_518;
      }
      MFIter::~MFIter(&mfi);
    }
  }
  else {
    this_02 = &mfi;
    std::array<amrex::MultiFab,_3UL>::array((array<amrex::MultiFab,_3UL> *)this_02);
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      BoxArray::BoxArray((BoxArray *)&result,
                         &(local_5f0->_M_elems[lVar10]->super_FabArray<amrex::FArrayBox>).
                          super_FabArrayBase.boxarray);
      BoxArray::coarsen((BoxArray *)&result,local_5d8);
      local_650._0_8_ = (double *)0x1;
      local_638 = 0;
      aDStack_630[0].x = 0;
      aDStack_630[0].y = 0;
      local_650._8_8_ = 0;
      local_650._16_8_ = 0;
      local_510.p = (double *)&PTR__FabFactory_006d8928;
      (*(((MultiFab *)&this_02->m_fa)->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
        _vptr_FabArrayBase[2])
                (this_02,(BoxArray *)&result,
                 &(local_5f0->_M_elems[lVar10]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase
                  .distributionMap,(ulong)uVar2,local_5e0,local_650,&local_510);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_650 + 0x10));
      BoxArray::~BoxArray((BoxArray *)&result);
      this_02 = this_02 + 4;
    }
    src = (FabArray<amrex::FArrayBox> *)&mfi;
    result._8_8_ = local_330;
    result.bigend.vect._4_8_ = local_1b0;
    result.smallend.vect._0_8_ = src;
    EB_average_down_faces(local_5f0,(Array<MultiFab_*,_3> *)&result,local_5d8,(int)local_5e0);
    pAVar7 = local_518;
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      this = &pAVar7->_M_elems[lVar10]->super_FabArray<amrex::FArrayBox>;
      period = Periodicity::NonPeriodic();
      FabArray<amrex::FArrayBox>::ParallelCopy
                (this,src,0,0,uVar2,(int)local_5e0,(int)local_5e0,period,COPY);
      src = src + 1;
    }
    std::array<amrex::MultiFab,_3UL>::~array((array<amrex::MultiFab,_3UL> *)&mfi);
  }
  return;
}

Assistant:

void EB_average_down_faces (const Array<const MultiFab*,AMREX_SPACEDIM>& fine,
                            const Array<MultiFab*,AMREX_SPACEDIM>& crse,
                            const IntVect& ratio, int ngcrse)
{
    AMREX_ASSERT(crse[0]->nComp() == fine[0]->nComp());

    int ncomp = crse[0]->nComp();
    if (!(*fine[0]).hasEBFabFactory())
    {
        amrex::average_down_faces(fine, crse, ratio, ngcrse);
    }
    else
    {
        Dim3 dratio = ratio.dim3();

        const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>((*fine[0]).Factory());
        const auto&  aspect = factory.getAreaFrac();

        if (isMFIterSafe(*fine[0], *crse[0]))
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (int n=0; n<AMREX_SPACEDIM; ++n) {
                for (MFIter mfi(*crse[n],TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const auto& flag_fab = amrex::getEBCellFlagFab((*fine[n])[mfi]);
                    const Box& tbx = mfi.growntilebox(ngcrse);
                    FabType typ = flag_fab.getType(amrex::refine(tbx,ratio));

                    Array4<Real> const& ca = crse[n]->array(mfi);
                    Array4<Real const> const& fa = fine[n]->const_array(mfi);

                    if(typ == FabType::regular || typ == FabType::covered)
                    {
                        AMREX_LAUNCH_HOST_DEVICE_LAMBDA(tbx, b,
                        {
                            amrex_avgdown_faces(b, ca, fa, 0, 0, ncomp, ratio, n);
                        });
                    }
                    else
                    {
                        Array4<Real const> const& ap = aspect[n]->const_array(mfi);
                        if (n == 0) {
                            AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                            {
                                eb_avgdown_face_x(i,j,k,fa,0,ca,0,ap,dratio,ncomp);
                            });
                        } else if (n == 1) {
                            AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                            {
                                eb_avgdown_face_y(i,j,k,fa,0,ca,0,ap,dratio,ncomp);
                            });
                        } else {
#if (AMREX_SPACEDIM == 3)
                            AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                            {
                                eb_avgdown_face_z(i,j,k,fa,0,ca,0,ap,dratio,ncomp);
                            });
#endif
                        }
                    }
                }
            }
        }
        else
        {
            Array<MultiFab,AMREX_SPACEDIM> ctmp;
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                BoxArray cba = fine[idim]->boxArray();
                cba.coarsen(ratio);
                ctmp[idim].define(cba, fine[idim]->DistributionMap(), ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            }
            EB_average_down_faces(fine, amrex::GetArrOfPtrs(ctmp), ratio, ngcrse);
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                crse[idim]->ParallelCopy(ctmp[idim],0,0,ncomp,ngcrse,ngcrse);
            }
        }
    }
}